

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::JoinCommonEdges(Clipper *this,bool fixHoleLinkages)

{
  bool bVar1;
  int iVar2;
  pointer ppJVar3;
  JoinRec *pJVar4;
  OutPt *p1;
  JoinRec *pt;
  double dVar5;
  IntPoint pt2_00;
  IntPoint pt2b;
  IntPoint pt1b;
  IntPoint pt3_00;
  IntPoint pt1a;
  IntPoint pt2a;
  OutRec *pOVar6;
  OutRec *this_00;
  OutPt *this_01;
  long64 p2;
  bool bVar7;
  bool bVar8;
  Clipper *this_02;
  OutPt *pOVar9;
  OutPt *pOVar10;
  long lVar11;
  OutPt *pOVar12;
  int iVar13;
  long64 lVar14;
  long lVar15;
  bool UseFullInt64Range;
  bool UseFullInt64Range_00;
  bool UseFullInt64Range_01;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 UseFullInt64Range_02;
  Clipper *pCVar16;
  ulong uVar17;
  size_type i;
  ulong uVar18;
  undefined7 in_register_00000031;
  pointer ppOVar19;
  Clipper *p1_00;
  pointer ppOVar20;
  OutPt *pOVar21;
  Clipper *pCVar22;
  long64 lVar23;
  ulong uVar24;
  IntPoint pt1_00;
  IntPoint pt1_01;
  IntPoint pt3_01;
  IntPoint pt_00;
  IntPoint pt_01;
  IntPoint pt_02;
  IntPoint pt_03;
  IntPoint pt_04;
  IntPoint pt_05;
  IntPoint pt_06;
  OutRec *outRec2;
  Clipper *local_d8;
  OutRec *local_d0;
  long local_c8;
  Clipper *local_c0;
  OutPt *local_b8;
  undefined4 local_ac;
  OutPt *pp2a;
  OutPt *local_a0;
  ulong local_98;
  OutPt *pp1a;
  IntPoint pt2;
  IntPoint pt1;
  IntPoint pt3;
  IntPoint pt4;
  
  local_ac = (undefined4)CONCAT71(in_register_00000031,fixHoleLinkages);
  uVar24 = 1;
  uVar18 = 0;
  do {
    ppJVar3 = (this->m_Joins).
              super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Joins).
                      super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar3 >> 3) <= uVar18) {
      return;
    }
    pJVar4 = ppJVar3[uVar18];
    ppOVar20 = (this->m_PolyOuts).
               super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_d0 = ppOVar20[pJVar4->poly1Idx];
    pp1a = local_d0->pts;
    outRec2 = ppOVar20[pJVar4->poly2Idx];
    pp2a = outRec2->pts;
    pt1.X = (pJVar4->pt2a).X;
    pt1.Y = (pJVar4->pt2a).Y;
    pt2.X = (pJVar4->pt2b).X;
    pt2.Y = (pJVar4->pt2b).Y;
    pt3.X = (pJVar4->pt1a).X;
    pt3.Y = (pJVar4->pt1a).Y;
    pt4.X = (pJVar4->pt1b).X;
    pt4.Y = (pJVar4->pt1b).Y;
    bVar7 = FindSegment(&pp1a,&pt1,&pt2);
    pOVar12 = pp1a;
    if (bVar7) {
      if (pJVar4->poly1Idx == pJVar4->poly2Idx) {
        pp2a = pp1a->next;
        bVar7 = FindSegment(&pp2a,&pt3,&pt4);
        if ((bVar7) && (pp2a != pOVar12)) {
LAB_00585f5e:
          pt1a.Y = pt1.Y;
          pt1a.X = pt1.X;
          pt1b.Y = pt2.Y;
          pt1b.X = pt2.X;
          pt2a.Y = pt3.Y;
          pt2a.X = pt3.X;
          pt2b.Y = pt4.Y;
          pt2b.X = pt4.X;
          bVar7 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&pt1,&pt2);
          lVar14 = pt1.Y;
          p2 = pt1.X;
          if (bVar7) {
            p1_00 = (Clipper *)pp1a->prev;
            ppOVar20 = (pointer)(pp1a->pt).X;
            ppOVar19 = (pointer)(pp1a->pt).Y;
            pCVar22 = (Clipper *)((ulong)ppOVar19 ^ pt1.Y | (ulong)ppOVar20 ^ pt1.X);
            pCVar16 = (Clipper *)pp1a;
            this_02 = (Clipper *)pp1a;
            local_98 = uVar24;
            if ((pCVar22 != (Clipper *)0x0) &&
               (((p1_00->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)pt1.X ||
                (this_02 = p1_00, pCVar22 = p1_00,
                (p1_00->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_finish != (pointer)pt1.Y)))) {
              local_d8 = (Clipper *)pp1a;
              pt_00.Y = (long64)pCVar22;
              pt_00.X = pt1.Y;
              this_02 = (Clipper *)
                        InsertPolyPtBetween((ClipperLib *)pp1a,(OutPt *)p1_00,(OutPt *)pt1.X,pt_00);
              ppOVar20 = (local_d8->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppOVar19 = (local_d8->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              pCVar16 = local_d8;
            }
            lVar23 = pt2.Y;
            pt3_00.Y = pt2.Y;
            pt3_00.X = pt2.X;
            pCVar22 = pCVar16;
            pOVar12 = (OutPt *)pt2.X;
            if ((ppOVar19 != (pointer)pt2.Y || ppOVar20 != (pointer)pt2.X) &&
               (((p1_00->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)pt2.X ||
                (pCVar22 = p1_00,
                (p1_00->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_finish != (pointer)pt2.Y)))) {
              local_c8 = lVar14;
              local_b8 = (OutPt *)pt2.X;
              if (this_02 == p1_00 || this_02 == pCVar16) {
                pt_01.Y = (long64)this_02;
                pt_01.X = pt2.Y;
                pCVar22 = (Clipper *)
                          InsertPolyPtBetween((ClipperLib *)pCVar16,(OutPt *)p1_00,(OutPt *)pt2.X,
                                              pt_01);
                lVar14 = local_c8;
                pOVar12 = local_b8;
              }
              else {
                pt2_00.X = (long64)(this_02->m_PolyOuts).
                                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                pt2_00.Y = (long64)(this_02->m_PolyOuts).
                                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                pt1_00.Y = (long64)ppOVar19;
                pt1_00.X = (long64)ppOVar20;
                lVar14 = pt2.X;
                local_d8 = pCVar16;
                local_c0 = this_02;
                bVar7 = Pt3IsBetweenPt1AndPt2(pt1_00,pt2_00,pt3_00);
                pOVar12 = local_b8;
                pCVar16 = local_c0;
                if (bVar7) {
                  p1_00 = local_c0;
                  pCVar16 = local_d8;
                }
                pt_02.Y = lVar14;
                pt_02.X = lVar23;
                pCVar22 = (Clipper *)
                          InsertPolyPtBetween((ClipperLib *)pCVar16,(OutPt *)p1_00,local_b8,pt_02);
                lVar14 = local_c8;
                this_02 = local_c0;
              }
            }
            this_01 = pp2a;
            p1 = pp2a->prev;
            pOVar10 = (OutPt *)(pp2a->pt).X;
            lVar11 = (pp2a->pt).Y;
            lVar15 = lVar14;
            pOVar21 = (OutPt *)p2;
            pOVar9 = pp2a;
            if ((lVar11 != lVar14 || pOVar10 != (OutPt *)p2) &&
               (((p1->pt).X != p2 ||
                (lVar15 = lVar11, pOVar21 = pOVar10, pOVar9 = p1, (p1->pt).Y != lVar14)))) {
              local_c8 = lVar23;
              pt_03.Y = (long64)this_02;
              pt_03.X = lVar14;
              local_d8 = pCVar22;
              local_b8 = pOVar12;
              pOVar9 = InsertPolyPtBetween((ClipperLib *)pp2a,p1,(OutPt *)p2,pt_03);
              pCVar22 = local_d8;
              lVar15 = (this_01->pt).Y;
              pOVar21 = (OutPt *)(this_01->pt).X;
              lVar23 = local_c8;
              pOVar12 = local_b8;
            }
            uVar24 = local_98;
            if (((pOVar21 != pOVar12) || (pOVar10 = this_01, lVar15 != lVar23)) &&
               (((OutPt *)(p1->pt).X != pOVar12 || (pOVar10 = p1, (p1->pt).Y != lVar23)))) {
              local_d8 = pCVar22;
              local_c0 = this_02;
              if (pOVar9 == p1 || pOVar9 == this_01) {
                pt_04.Y = (long64)this_02;
                pt_04.X = lVar23;
                pOVar10 = InsertPolyPtBetween((ClipperLib *)this_01,p1,pOVar12,pt_04);
                pCVar22 = local_d8;
                this_02 = local_c0;
              }
              else {
                pt1_01.Y = lVar15;
                pt1_01.X = (long64)pOVar21;
                pt3_01.Y = lVar23;
                pt3_01.X = (long64)pOVar12;
                local_c8 = lVar23;
                local_b8 = pOVar12;
                local_a0 = pOVar9;
                bVar7 = Pt3IsBetweenPt1AndPt2(pt1_01,pOVar9->pt,pt3_01);
                pOVar9 = local_a0;
                if (bVar7) {
                  pt_05.Y = (long64)pOVar12;
                  pt_05.X = local_c8;
                  pOVar10 = InsertPolyPtBetween((ClipperLib *)this_01,local_a0,local_b8,pt_05);
                  pCVar22 = local_d8;
                  this_02 = local_c0;
                }
                else {
                  pt_06.Y = (long64)pOVar12;
                  pt_06.X = local_c8;
                  pOVar10 = InsertPolyPtBetween((ClipperLib *)local_a0,p1,local_b8,pt_06);
                  pCVar22 = local_d8;
                  this_02 = local_c0;
                  pOVar9 = local_a0;
                }
              }
            }
            pOVar6 = local_d0;
            if ((Clipper *)
                (this_02->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == pCVar22) {
              lVar11 = 0x20;
              lVar15 = 0x18;
              if (pOVar9->prev != pOVar10) goto LAB_0058628b;
LAB_005862a8:
              *(OutPt **)((long)&this_02->_vptr_Clipper + lVar15) = pOVar9;
              *(Clipper **)((long)&pOVar9->idx + lVar11) = this_02;
              *(OutPt **)((long)&pCVar22->_vptr_Clipper + lVar11) = pOVar10;
              *(Clipper **)((long)&pOVar10->idx + lVar15) = pCVar22;
              if (pJVar4->poly2Idx == pJVar4->poly1Idx) {
                local_d8 = pCVar22;
                pOVar12 = GetBottomPt((OutPt *)this_02);
                local_d0->pts = pOVar12;
                local_d0->bottomPt = pOVar12;
                pOVar12->idx = local_d0->idx;
                outRec2 = CreateOutRec(this_02);
                std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::push_back
                          (&this->m_PolyOuts,&outRec2);
                pOVar6 = outRec2;
                outRec2->idx = (int)((ulong)((long)(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_PolyOuts).
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               -1;
                iVar2 = outRec2->idx;
                pJVar4->poly2Idx = iVar2;
                pOVar12 = GetBottomPt((OutPt *)local_d8);
                this_00 = local_d0;
                pOVar6->pts = pOVar12;
                pOVar6->bottomPt = pOVar12;
                pOVar12->idx = iVar2;
                bVar7 = PointInPolygon(&outRec2->pts->pt,local_d0->pts,
                                       (bool)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ]);
                uVar17 = uVar24;
                if (bVar7) {
                  outRec2->isHole = (bool)(this_00->isHole ^ 1);
                  outRec2->FirstLeft = this_00;
                  bVar7 = outRec2->isHole;
                  bVar1 = this->m_ReverseOutput;
                  bVar8 = Orientation((ClipperLib *)outRec2,
                                      (OutRec *)
                                      (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                                   [(long)&(this->m_PolyOuts).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ],UseFullInt64Range);
                  if (bVar7 == (bool)(bVar8 ^ bVar1)) {
                    ReversePolyPtLinks(outRec2->pts);
                  }
                }
                else {
                  bVar7 = PointInPolygon(&this_00->pts->pt,outRec2->pts,
                                         (bool)(this->_vptr_Clipper[-3] + 0x10)
                                               [(long)&(this->m_PolyOuts).
                                                                                                              
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                               ]);
                  outRec2->isHole = this_00->isHole;
                  if (bVar7) {
                    this_00->isHole = (bool)(outRec2->isHole ^ 1);
                    outRec2->FirstLeft = this_00->FirstLeft;
                    this_00->FirstLeft = outRec2;
                    bVar7 = this_00->isHole;
                    bVar1 = this->m_ReverseOutput;
                    bVar8 = Orientation((ClipperLib *)this_00,
                                        (OutRec *)
                                        (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                                     [(long)&(this->m_PolyOuts).
                                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ],SUB81(outRec2,0));
                    if (bVar7 == (bool)(bVar8 ^ bVar1)) {
                      ReversePolyPtLinks(local_d0->pts);
                    }
                  }
                  else {
                    outRec2->FirstLeft = this_00->FirstLeft;
                  }
                  if ((char)local_ac != '\0') {
                    CheckHoleLinkages1(this,local_d0,outRec2);
                  }
                }
                for (; pOVar6 = local_d0,
                    ppJVar3 = (this->m_Joins).
                              super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                    uVar24 < (ulong)((long)(this->m_Joins).
                                           super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppJVar3 >> 3); uVar24 = uVar24 + 1) {
                  pt = ppJVar3[uVar24];
                  iVar2 = pt->poly1Idx;
                  iVar13 = pJVar4->poly1Idx;
                  if ((iVar2 == pJVar4->poly1Idx) &&
                     (bVar7 = PointIsVertex(&pt->pt1a,(OutPt *)local_d8), iVar13 = iVar2, bVar7)) {
                    pt->poly1Idx = pJVar4->poly2Idx;
                    iVar13 = pJVar4->poly1Idx;
                  }
                  uVar17 = local_98;
                  if ((pt->poly2Idx == iVar13) &&
                     (bVar7 = PointIsVertex(&pt->pt2a,(OutPt *)local_d8), bVar7)) {
                    pt->poly2Idx = pJVar4->poly2Idx;
                  }
                }
                FixupOutPolygon(this,local_d0);
                FixupOutPolygon(this,outRec2);
                UseFullInt64Range_02 = UseFullInt64Range_01;
                if (pOVar6->pts != (OutPt *)0x0) {
                  bVar7 = Orientation((ClipperLib *)pOVar6,
                                      (OutRec *)
                                      (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                                   [(long)&(this->m_PolyOuts).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ],UseFullInt64Range_01);
                  dVar5 = Area(local_d0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                              [(long)&(this->m_PolyOuts).
                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                              ]);
                  UseFullInt64Range_02 = extraout_DL;
                  if (dVar5 <= 0.0 == bVar7) {
                    DisposeBottomPt(this,local_d0);
                    UseFullInt64Range_02 = extraout_DL_00;
                  }
                }
                uVar24 = uVar17;
                if (outRec2->pts != (OutPt *)0x0) {
                  bVar7 = Orientation((ClipperLib *)outRec2,
                                      (OutRec *)
                                      (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                                   [(long)&(this->m_PolyOuts).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ],(bool)UseFullInt64Range_02);
                  dVar5 = Area(outRec2,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ]);
                  if (dVar5 <= 0.0 == bVar7) {
                    DisposeBottomPt(this,outRec2);
                  }
                }
              }
              else {
                if ((char)local_ac != '\0') {
                  CheckHoleLinkages2(this,local_d0,outRec2);
                }
                FixupOutPolygon(this,pOVar6);
                if (pOVar6->pts != (OutPt *)0x0) {
                  bVar7 = Orientation((ClipperLib *)pOVar6,
                                      (OutRec *)
                                      (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                                   [(long)&(this->m_PolyOuts).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ],UseFullInt64Range_00);
                  pOVar6->isHole = !bVar7;
                  if ((!bVar7) && (pOVar6->FirstLeft == (OutRec *)0x0)) {
                    pOVar6->FirstLeft = outRec2->FirstLeft;
                  }
                }
                iVar2 = pOVar6->idx;
                iVar13 = outRec2->idx;
                outRec2->pts = (OutPt *)0x0;
                outRec2->bottomPt = (OutPt *)0x0;
                outRec2->AppendLink = pOVar6;
                for (uVar17 = uVar24;
                    ppJVar3 = (this->m_Joins).
                              super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                    uVar17 < (ulong)((long)(this->m_Joins).
                                           super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppJVar3 >> 3); uVar17 = uVar17 + 1) {
                  pJVar4 = ppJVar3[uVar17];
                  if (pJVar4->poly1Idx == iVar13) {
                    pJVar4->poly1Idx = iVar2;
                  }
                  if (pJVar4->poly2Idx == iVar13) {
                    pJVar4->poly2Idx = iVar2;
                  }
                }
              }
            }
            else {
LAB_0058628b:
              if ((Clipper *)
                  (this_02->m_Joins).
                  super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_start == pCVar22) {
                lVar11 = 0x18;
                lVar15 = 0x20;
                if (pOVar9->next == pOVar10) goto LAB_005862a8;
              }
            }
          }
        }
      }
      else {
        bVar7 = FindSegment(&pp2a,&pt3,&pt4);
        if (bVar7) goto LAB_00585f5e;
      }
    }
    uVar18 = uVar18 + 1;
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

void Clipper::JoinCommonEdges(bool fixHoleLinkages)
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
  {
    JoinRec* j = m_Joins[i];
    OutRec *outRec1 = m_PolyOuts[j->poly1Idx];
    OutPt *pp1a = outRec1->pts;
    OutRec *outRec2 = m_PolyOuts[j->poly2Idx];
    OutPt *pp2a = outRec2->pts;
    IntPoint pt1 = j->pt2a, pt2 = j->pt2b;
    IntPoint pt3 = j->pt1a, pt4 = j->pt1b;
    if (!FindSegment(pp1a, pt1, pt2)) continue;
    if (j->poly1Idx == j->poly2Idx)
    {
      //we're searching the same polygon for overlapping segments so
      //segment 2 mustn't be the same as segment 1 ...
      pp2a = pp1a->next;
      if (!FindSegment(pp2a, pt3, pt4) || (pp2a == pp1a)) continue;
    }
    else if (!FindSegment(pp2a, pt3, pt4)) continue;

    if (!GetOverlapSegment(pt1, pt2, pt3, pt4, pt1, pt2)) continue;

    OutPt *p1, *p2, *p3, *p4;
    OutPt *prev = pp1a->prev;
    //get p1 & p2 polypts - the overlap start & endpoints on poly1
    if (PointsEqual(pp1a->pt, pt1)) p1 = pp1a;
    else if (PointsEqual(prev->pt, pt1)) p1 = prev;
    else p1 = InsertPolyPtBetween(pp1a, prev, pt1);

    if (PointsEqual(pp1a->pt, pt2)) p2 = pp1a;
    else if (PointsEqual(prev->pt, pt2)) p2 = prev;
    else if ((p1 == pp1a) || (p1 == prev))
      p2 = InsertPolyPtBetween(pp1a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp1a->pt, p1->pt, pt2))
      p2 = InsertPolyPtBetween(pp1a, p1, pt2); else
      p2 = InsertPolyPtBetween(p1, prev, pt2);

    //get p3 & p4 polypts - the overlap start & endpoints on poly2
    prev = pp2a->prev;
    if (PointsEqual(pp2a->pt, pt1)) p3 = pp2a;
    else if (PointsEqual(prev->pt, pt1)) p3 = prev;
    else p3 = InsertPolyPtBetween(pp2a, prev, pt1);

    if (PointsEqual(pp2a->pt, pt2)) p4 = pp2a;
    else if (PointsEqual(prev->pt, pt2)) p4 = prev;
    else if ((p3 == pp2a) || (p3 == prev))
      p4 = InsertPolyPtBetween(pp2a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp2a->pt, p3->pt, pt2))
      p4 = InsertPolyPtBetween(pp2a, p3, pt2); else
      p4 = InsertPolyPtBetween(p3, prev, pt2);

    //p1.pt == p3.pt and p2.pt == p4.pt so join p1 to p3 and p2 to p4 ...
    if (p1->next == p2 && p3->prev == p4)
    {
      p1->next = p3;
      p3->prev = p1;
      p2->prev = p4;
      p4->next = p2;
    }
    else if (p1->prev == p2 && p3->next == p4)
    {
      p1->prev = p3;
      p3->next = p1;
      p2->next = p4;
      p4->prev = p2;
    }
    else
      continue; //an orientation is probably wrong

    if (j->poly2Idx == j->poly1Idx)
    {
      //instead of joining two polygons, we've just created a new one by
      //splitting one polygon into two.
      outRec1->pts = GetBottomPt(p1);
      outRec1->bottomPt = outRec1->pts;
      outRec1->bottomPt->idx = outRec1->idx;
      outRec2 = CreateOutRec();
      m_PolyOuts.push_back(outRec2);
      outRec2->idx = (int)m_PolyOuts.size()-1;
      j->poly2Idx = outRec2->idx;
      outRec2->pts = GetBottomPt(p2);
      outRec2->bottomPt = outRec2->pts;
      outRec2->bottomPt->idx = outRec2->idx;

      if (PointInPolygon(outRec2->pts->pt, outRec1->pts, m_UseFullRange))
      {
        //outRec2 is contained by outRec1 ...
        outRec2->isHole = !outRec1->isHole;
        outRec2->FirstLeft = outRec1;
        if (outRec2->isHole ==
          (m_ReverseOutput ^ Orientation(outRec2, m_UseFullRange)))
            ReversePolyPtLinks(*outRec2->pts);
      } else if (PointInPolygon(outRec1->pts->pt, outRec2->pts, m_UseFullRange))
      {
        //outRec1 is contained by outRec2 ...
        outRec2->isHole = outRec1->isHole;
        outRec1->isHole = !outRec2->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        outRec1->FirstLeft = outRec2;
        if (outRec1->isHole ==
          (m_ReverseOutput ^ Orientation(outRec1, m_UseFullRange)))
            ReversePolyPtLinks(*outRec1->pts);
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      } else
      {
        outRec2->isHole = outRec1->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      }

      //now fixup any subsequent joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == j->poly1Idx && PointIsVertex(j2->pt1a, p2))
          j2->poly1Idx = j->poly2Idx;
        if (j2->poly2Idx == j->poly1Idx && PointIsVertex(j2->pt2a, p2))
          j2->poly2Idx = j->poly2Idx;
      }

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);
      FixupOutPolygon(*outRec2);

      if (outRec1->pts && (Orientation(outRec1, m_UseFullRange) != (Area(*outRec1, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec1);
      if (outRec2->pts && (Orientation(outRec2, m_UseFullRange) != (Area(*outRec2, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec2);

    } else
    {
      //joined 2 polygons together ...

      //make sure any holes contained by outRec2 now link to outRec1 ...
      if (fixHoleLinkages) CheckHoleLinkages2(outRec1, outRec2);

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);

      if (outRec1->pts)
      {
        outRec1->isHole = !Orientation(outRec1, m_UseFullRange);
        if (outRec1->isHole && !outRec1->FirstLeft)
          outRec1->FirstLeft = outRec2->FirstLeft;
      }

      //delete the obsolete pointer ...
      int OKIdx = outRec1->idx;
      int ObsoleteIdx = outRec2->idx;
      outRec2->pts = 0;
      outRec2->bottomPt = 0;
      outRec2->AppendLink = outRec1;

      //now fixup any subsequent Joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == ObsoleteIdx) j2->poly1Idx = OKIdx;
        if (j2->poly2Idx == ObsoleteIdx) j2->poly2Idx = OKIdx;
      }
    }
  }
}